

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ParseMeshChunk(Discreet3DSImporter *this)

{
  vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_> *this_00;
  StreamReader<false,_false> *this_01;
  pointer pMVar1;
  pointer pFVar2;
  ushort uVar3;
  uint _limit;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  Face local_58;
  Chunk chunk;
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&chunk);
    } while ((int)(chunk.Size - 6) < 1);
    this_01 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_01,(chunk.Size - 6) +
                                (*(int *)&this_01->current - *(int *)&this_01->buffer));
    uVar4 = (uint)chunk.Flag << 0x1c | chunk.Flag - 0x4110 >> 4;
    if (uVar4 < 6) {
      pMVar1 = (this->mScene->mMeshes).
               super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
               super__Vector_impl_data._M_finish;
      switch(uVar4) {
      case 0:
        uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
        uVar5 = (ulong)uVar3;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(pMVar1 + -1),
                   uVar5);
        for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
          local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0;
          local_58.super_FaceWithSmoothingGroup.mIndices[1] = 0;
          local_58.super_FaceWithSmoothingGroup._8_8_ =
               local_58.super_FaceWithSmoothingGroup._8_8_ & 0xffffffff00000000;
          fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
          local_58.super_FaceWithSmoothingGroup.mIndices[0] = (uint32_t)fVar6;
          fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
          local_58.super_FaceWithSmoothingGroup.mIndices[1] = (uint32_t)fVar6;
          fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
          local_58.super_FaceWithSmoothingGroup.mIndices[2] = (uint32_t)fVar6;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(pMVar1 + -1)
                     ,(value_type *)&local_58);
        }
        break;
      case 1:
        uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
        uVar5 = (ulong)uVar3;
        this_00 = &pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces;
        std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::reserve(this_00,uVar5)
        ;
        for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
          local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0xffffffff;
          local_58.super_FaceWithSmoothingGroup.mIndices[1] = 0xffffffff;
          local_58.super_FaceWithSmoothingGroup.mIndices[2] = 0xffffffff;
          local_58.super_FaceWithSmoothingGroup.iSmoothGroup = 0;
          std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::
          emplace_back<Assimp::D3DS::Face>(this_00,&local_58);
          pFVar2 = pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                   super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
          pFVar2[-1].super_FaceWithSmoothingGroup.mIndices[0] = (uint)uVar3;
          uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
          pFVar2[-1].super_FaceWithSmoothingGroup.mIndices[1] = (uint)uVar3;
          uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
          pFVar2[-1].super_FaceWithSmoothingGroup.mIndices[2] = (uint)uVar3;
          StreamReader<false,_false>::IncPtr(this->stream,2);
        }
        local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0xcdcdcdcd;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&pMVar1[-1].mFaceMaterials,
                   (long)pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                         super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                         super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4,
                   (value_type_conflict4 *)&local_58);
        if (6 < *(int *)&this->stream->limit - *(int *)&this->stream->current) {
          ParseFaceChunk(this);
        }
        break;
      case 3:
        uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
        uVar5 = (ulong)uVar3;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  (&pMVar1[-1].mTexCoords,uVar5);
        for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
          local_58.super_FaceWithSmoothingGroup.mIndices[0] = 0;
          local_58.super_FaceWithSmoothingGroup.mIndices[1] = 0;
          local_58.super_FaceWithSmoothingGroup._8_8_ =
               local_58.super_FaceWithSmoothingGroup._8_8_ & 0xffffffff00000000;
          fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
          local_58.super_FaceWithSmoothingGroup.mIndices[0] = (uint32_t)fVar6;
          fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
          local_58.super_FaceWithSmoothingGroup.mIndices[1] = (uint32_t)fVar6;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (&pMVar1[-1].mTexCoords,(value_type *)&local_58);
        }
        break;
      case 5:
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.a1 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.b1 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.c1 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.a2 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.b2 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.c2 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.a3 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.b3 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.c3 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.a4 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.b4 = fVar6;
        fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
        pMVar1[-1].mMat.c4 = fVar6;
      }
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
  } while (*(int *)&this->stream->limit != *(int *)&this->stream->current);
  return;
}

Assistant:

void Discreet3DSImporter::ParseMeshChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // Get the mesh we're currently working on
    D3DS::Mesh& mMesh = mScene->mMeshes.back();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_VERTLIST:
        {
        // This is the list of all vertices in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mPositions.reserve(num);
        while (num-- > 0)   {
            aiVector3D v;
            v.x = stream->GetF4();
            v.y = stream->GetF4();
            v.z = stream->GetF4();
            mMesh.mPositions.push_back(v);
        }}
        break;
    case Discreet3DS::CHUNK_TRMATRIX:
        {
        // This is the RLEATIVE transformation matrix of the current mesh. Vertices are
        // pretransformed by this matrix wonder.
        mMesh.mMat.a1 = stream->GetF4();
        mMesh.mMat.b1 = stream->GetF4();
        mMesh.mMat.c1 = stream->GetF4();
        mMesh.mMat.a2 = stream->GetF4();
        mMesh.mMat.b2 = stream->GetF4();
        mMesh.mMat.c2 = stream->GetF4();
        mMesh.mMat.a3 = stream->GetF4();
        mMesh.mMat.b3 = stream->GetF4();
        mMesh.mMat.c3 = stream->GetF4();
        mMesh.mMat.a4 = stream->GetF4();
        mMesh.mMat.b4 = stream->GetF4();
        mMesh.mMat.c4 = stream->GetF4();
        }
        break;

    case Discreet3DS::CHUNK_MAPLIST:
        {
        // This is the list of all UV coords in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mTexCoords.reserve(num);
        while (num-- > 0)   {
            aiVector3D v;
            v.x = stream->GetF4();
            v.y = stream->GetF4();
            mMesh.mTexCoords.push_back(v);
        }}
        break;

    case Discreet3DS::CHUNK_FACELIST:
        {
        // This is the list of all faces in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mFaces.reserve(num);
        while (num-- > 0)   {
            // 3DS faces are ALWAYS triangles
            mMesh.mFaces.push_back(D3DS::Face());
            D3DS::Face& sFace = mMesh.mFaces.back();

            sFace.mIndices[0] = (uint16_t)stream->GetI2();
            sFace.mIndices[1] = (uint16_t)stream->GetI2();
            sFace.mIndices[2] = (uint16_t)stream->GetI2();

            stream->IncPtr(2); // skip edge visibility flag
        }

        // Resize the material array (0xcdcdcdcd marks the default material; so if a face is
        // not referenced by a material, $$DEFAULT will be assigned to it)
        mMesh.mFaceMaterials.resize(mMesh.mFaces.size(),0xcdcdcdcd);

        // Larger 3DS files could have multiple FACE chunks here
        chunkSize = stream->GetRemainingSizeToLimit();
        if ( chunkSize > (int) sizeof(Discreet3DS::Chunk ) )
            ParseFaceChunk();
        }
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}